

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_write_mtx_crd(char *fname,int M,int N,int nz,int *I,int *J,double *val,char *matcode)

{
  char cVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = strcmp(fname,"stdout");
  __stream = _stdout;
  if ((iVar2 != 0) && (__stream = fopen(fname,"w"), __stream == (FILE *)0x0)) {
    return 0x11;
  }
  uVar4 = 0;
  fprintf(__stream,"%s ","%%MatrixMarket");
  pcVar3 = mm_typecode_to_str(matcode);
  fprintf(__stream,"%s\n",pcVar3);
  fprintf(__stream,"%d %d %d\n",M,(ulong)(uint)N,(ulong)(uint)nz);
  cVar1 = matcode[2];
  if (cVar1 == 'R') {
    uVar5 = (ulong)(uint)nz;
    if (nz < 1) {
      uVar5 = 0;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      fprintf(__stream,"%d %d %20.16g\n",val[uVar4],(ulong)(uint)I[uVar4],(ulong)(uint)J[uVar4]);
    }
  }
  else if (cVar1 == 'P') {
    if (nz < 1) {
      nz = 0;
    }
    for (uVar4 = 0; (uint)nz != uVar4; uVar4 = uVar4 + 1) {
      fprintf(__stream,"%d %d\n",(ulong)(uint)I[uVar4],(ulong)(uint)J[uVar4]);
    }
  }
  else {
    if (cVar1 != 'C') {
      iVar2 = 0xf;
      goto LAB_0010420c;
    }
    uVar5 = 0;
    uVar4 = (ulong)(uint)nz;
    if (nz < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 * 4 != uVar5; uVar5 = uVar5 + 4) {
      fprintf(__stream,"%d %d %20.16g %20.16g\n",*(undefined8 *)((long)val + uVar5 * 4),
              *(undefined8 *)((long)val + uVar5 * 4 + 8),(ulong)*(uint *)((long)I + uVar5),
              (ulong)*(uint *)((long)J + uVar5));
    }
  }
  iVar2 = 0;
LAB_0010420c:
  if (__stream != _stdout) {
    fclose(__stream);
  }
  return iVar2;
}

Assistant:

int mm_write_mtx_crd(char fname[], int M, int N, int nz, int I[], int J[],
                     double val[], MM_typecode matcode) {
    FILE *f;
    int i;

    if (strcmp(fname, "stdout") == 0)
        f = stdout;
    else if ((f = fopen(fname, "w")) == NULL)
        return MM_COULD_NOT_WRITE_FILE;

    /* print banner followed by typecode */
    fprintf(f, "%s ", MatrixMarketBanner);
    fprintf(f, "%s\n", mm_typecode_to_str(matcode));

    /* print matrix sizes and nonzeros */
    fprintf(f, "%d %d %d\n", M, N, nz);

    /* print values */
    if (mm_is_pattern(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d\n", I[i], J[i]);
    else if (mm_is_real(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d %20.16g\n", I[i], J[i], val[i]);
    else if (mm_is_complex(matcode))
        for (i = 0; i < nz; i++)
            fprintf(f, "%d %d %20.16g %20.16g\n", I[i], J[i], val[2 * i],
                    val[2 * i + 1]);
    else {
        if (f != stdout) fclose(f);
        return MM_UNSUPPORTED_TYPE;
    }

    if (f != stdout) fclose(f);

    return 0;
}